

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vec.h
# Opt level: O1

bool __thiscall
__gnu_cxx::__ops::_Val_less_iter::operator()
          (_Val_less_iter *this,pair<crnlib::vec<2U,_float>,_unsigned_int> *__val,
          pair<crnlib::vec<2U,_float>,_unsigned_int> *__it)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  
  fVar1 = (__val->first).m_s[0];
  fVar2 = (__it->first).m_s[0];
  if (fVar1 < fVar2) {
    return true;
  }
  bVar5 = fVar1 == fVar2;
  bVar6 = bVar5;
  bVar7 = bVar5;
  if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
LAB_00181e80:
    bVar7 = (bool)(bVar7 ^ 1U | fVar1 != fVar2);
  }
  else {
    fVar3 = (__val->first).m_s[1];
    fVar4 = (__it->first).m_s[1];
    bVar7 = true;
    if (fVar4 <= fVar3) {
      bVar6 = false;
      bVar7 = fVar3 == fVar4;
      goto LAB_00181e80;
    }
  }
  if ((bVar6) && (bVar7)) {
    return true;
  }
  if (fVar2 < fVar1) {
    return false;
  }
  bVar6 = bVar5;
  if ((fVar2 == fVar1) && (!NAN(fVar2) && !NAN(fVar1))) {
    fVar3 = (__it->first).m_s[1];
    fVar4 = (__val->first).m_s[1];
    bVar6 = true;
    if (fVar3 < fVar4) goto LAB_00181ee8;
    bVar5 = false;
    bVar6 = fVar3 == fVar4;
  }
  bVar6 = (bool)(bVar6 ^ 1U | fVar2 != fVar1);
LAB_00181ee8:
  if ((bVar5) && (bVar6)) {
    return false;
  }
  return __val->second < __it->second;
}

Assistant:

inline bool operator<(const vec& rhs) const
        {
            for (uint i = 0; i < N; i++)
            {
                if (m_s[i] < rhs.m_s[i])
                {
                    return true;
                }
                else if (m_s[i] != rhs.m_s[i])
                {
                    return false;
                }
            }

            return false;
        }